

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-val.c
# Opt level: O2

wchar_t borg_lookup_kind(wchar_t tval,wchar_t sval)

{
  char *pcVar1;
  int *piVar2;
  ulong uVar3;
  
  piVar2 = &k_info[1].sval;
  for (uVar3 = 1; uVar3 < z_info->k_max; uVar3 = uVar3 + 1) {
    if ((piVar2[-1] == tval) && (*piVar2 == sval)) goto LAB_0021ae59;
    piVar2 = piVar2 + 0xa8;
  }
  pcVar1 = tval_find_name(tval);
  uVar3 = 0;
  msg("No object (%s,%d,%d)",pcVar1,tval,sval);
LAB_0021ae59:
  return (wchar_t)uVar3;
}

Assistant:

int borg_lookup_kind(int tval, int sval)
{
    int k;

    /* Look for it */
    for (k = 1; k < z_info->k_max; k++) {
        struct object_kind *k_ptr = &k_info[k];

        /* Found a match */
        if ((k_ptr->tval == tval) && (k_ptr->sval == sval))
            return (k);
    }

    /* Failure */
    msg("No object (%s,%d,%d)", tval_find_name(tval), tval, sval);
    return 0;
}